

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

void __thiscall VulkanHppGenerator::filterLenMembers(VulkanHppGenerator *this)

{
  int line;
  bool bVar1;
  reference ppVar2;
  vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_> *this_00;
  reference pMVar3;
  reference __rhs;
  const_iterator __first;
  pointer pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  __normal_iterator<VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
  local_88;
  __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
  local_80;
  const_iterator lenMemberIt;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *lenMember;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *__range3;
  MemberData *member;
  iterator __end2;
  iterator __begin2;
  vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_> *__range2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>
  *sd;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
  *__range1;
  VulkanHppGenerator *this_local;
  
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
           ::begin(&this->m_structs);
  sd = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
          ::end(&this->m_structs);
  while( true ) {
    bVar1 = std::operator==(&__end1,(_Self *)&sd);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>
             ::operator*(&__end1);
    this_00 = &(ppVar2->second).members;
    __end2 = std::
             vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
             ::begin(this_00);
    member = (MemberData *)
             std::
             vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
             ::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                        (&__end2,(__normal_iterator<VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                                  *)&member);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pMVar3 = __gnu_cxx::
               __normal_iterator<VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
               ::operator*(&__end2);
      std::
      erase_if<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>,VulkanHppGenerator::filterLenMembers()::__0>
                (&pMVar3->lenMembers,(anon_class_8_1_8991fb9c_for__M_pred)this);
      __end3 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::begin(&pMVar3->lenMembers);
      lenMember = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                   *)std::
                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     ::end(&pMVar3->lenMembers);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                          (&__end3,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                                    *)&lenMember);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        lenMemberIt._M_current =
             (MemberData *)
             __gnu_cxx::
             __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
             ::operator*(&__end3);
        if (((lenMemberIt._M_current)->type).prefix._M_dataplus._M_p == (pointer)0xffffffffffffffff)
        {
          local_80._M_current =
               (MemberData *)
               findStructMemberIt(this,(string *)lenMemberIt._M_current,&(ppVar2->second).members);
          local_88._M_current =
               (MemberData *)
               std::
               vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
               ::end(&(ppVar2->second).members);
          bVar1 = __gnu_cxx::
                  operator==<const_VulkanHppGenerator::MemberData_*,_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                            (&local_80,&local_88);
          line = pMVar3->xmlLine;
          std::operator+(&local_148,"struct member <",&pMVar3->name);
          std::operator+(&local_128,&local_148,"> uses unknown len member <");
          std::operator+(&local_108,&local_128,&(lenMemberIt._M_current)->defaultValue);
          std::operator+(&local_e8,&local_108,"> in its \"altlen\" attribute <");
          __rhs = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&pMVar3->lenExpressions,0);
          std::operator+(&local_c8,&local_e8,__rhs);
          std::operator+(&local_a8,&local_c8,">");
          checkForError(!bVar1,line,&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&local_148);
          __first = std::
                    vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                    ::cbegin(&(ppVar2->second).members);
          pcVar4 = (pointer)std::
                            distance<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>
                                      ((__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                                        )__first._M_current,local_80);
          ((lenMemberIt._M_current)->type).prefix._M_dataplus._M_p = pcVar4;
        }
        __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
        ::operator++(&__end3);
      }
      __gnu_cxx::
      __normal_iterator<VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
      ::operator++(&__end2);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void VulkanHppGenerator::filterLenMembers()
{
  for ( auto & sd : m_structs )
  {
    for ( auto & member : sd.second.members )
    {
      std::erase_if( member.lenMembers, [this]( std::pair<std::string, size_t> const & nameIndex ) { return m_constants.contains( nameIndex.first ); } );

      for ( auto & lenMember : member.lenMembers )
      {
        if ( lenMember.second == static_cast<size_t>( ~0 ) )
        {
          auto lenMemberIt = findStructMemberIt( lenMember.first, sd.second.members );
          checkForError( lenMemberIt != sd.second.members.end(),
                         member.xmlLine,
                         "struct member <" + member.name + "> uses unknown len member <" + lenMember.first + "> in its \"altlen\" attribute <" +
                           member.lenExpressions[0] + ">" );
          lenMember.second = std::distance( sd.second.members.cbegin(), lenMemberIt );
        }
      }
    }
  }
}